

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_row.cc
# Opt level: O0

void __thiscall
transition_row_append_Test::transition_row_append_Test(transition_row_append_Test *this)

{
  transition_row_append_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__transition_row_append_Test_0017f890;
  return;
}

Assistant:

TEST(transition_row, append) {
    auto row1 = make_row(t1());
    static_assert(decltype(row1)::size == 1, "");

    EXPECT_TRUE(std::get<0>(row1.data()).guard(e1{1}));
    EXPECT_FALSE(std::get<0>(row1.data()).guard(e1{0}));

    auto row2 = std::move(row1).append(t2());
    static_assert(decltype(row2)::size == 2, "");

    EXPECT_TRUE(std::get<0>(row2.data()).guard(e1{1}));
    EXPECT_FALSE(std::get<0>(row2.data()).guard(e1{0}));

    EXPECT_FALSE(std::get<1>(row2.data()).guard(e1{1}));
    EXPECT_TRUE(std::get<1>(row2.data()).guard(e1{0}));
}